

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O2

QLatin1StringView __thiscall
QMimeBinaryProvider::iconForMime
          (QMimeBinaryProvider *this,CacheFile *cacheFile,int posListOffset,QByteArray *inputMime)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  char *str2;
  uint uVar6;
  long lVar7;
  long in_FS_OFFSET;
  QLatin1StringView QVar8;
  QLatin1String local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar6 = *(uint *)(cacheFile->data + posListOffset);
  uVar3 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  uVar6 = *(uint *)(cacheFile->data + (int)uVar3);
  iVar5 = 0;
  uVar6 = uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 | uVar6 << 0x18;
  do {
    while( true ) {
      if ((int)uVar6 <= iVar5) {
        local_48.m_size = 0;
        local_48.m_data = (char *)0x0;
        goto LAB_0044a511;
      }
      str2 = (inputMime->d).ptr;
      if (str2 == (char *)0x0) {
        str2 = &QByteArray::_empty;
      }
      uVar4 = iVar5 + (uVar6 - 1) >> 1;
      lVar7 = (long)(int)(uVar3 + 4 + uVar4 * 8);
      uVar1 = *(uint *)(cacheFile->data + lVar7);
      iVar2 = qstrcmp((char *)(cacheFile->data +
                              (int)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8
                                   | uVar1 << 0x18)),str2);
      if (-1 < iVar2) break;
      iVar5 = uVar4 + 1;
    }
    uVar6 = uVar4;
  } while (iVar2 != 0);
  uVar6 = *(uint *)(cacheFile->data + lVar7 + 4);
  QLatin1String::QLatin1String
            (&local_48,
             (char *)(cacheFile->data +
                     (int)(uVar6 >> 0x18 | (uVar6 & 0xff0000) >> 8 | (uVar6 & 0xff00) << 8 |
                          uVar6 << 0x18)));
LAB_0044a511:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    QVar8.m_data = local_48.m_data;
    QVar8.m_size = local_48.m_size;
    return QVar8;
  }
  __stack_chk_fail();
}

Assistant:

QLatin1StringView QMimeBinaryProvider::iconForMime(CacheFile *cacheFile, int posListOffset,
                                                   const QByteArray &inputMime)
{
    const int iconsListOffset = cacheFile->getUint32(posListOffset);
    const int numIcons = cacheFile->getUint32(iconsListOffset);
    int begin = 0;
    int end = numIcons - 1;
    while (begin <= end) {
        const int medium = (begin + end) / 2;
        const int off = iconsListOffset + 4 + 8 * medium;
        const int mimeOffset = cacheFile->getUint32(off);
        const char *mime = cacheFile->getCharStar(mimeOffset);
        const int cmp = qstrcmp(mime, inputMime);
        if (cmp < 0)
            begin = medium + 1;
        else if (cmp > 0)
            end = medium - 1;
        else {
            const int iconOffset = cacheFile->getUint32(off + 4);
            return QLatin1StringView(cacheFile->getCharStar(iconOffset));
        }
    }
    return QLatin1StringView();
}